

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O2

void __thiscall
correctness_mul_div_randomized_Test::TestBody(correctness_mul_div_randomized_Test *this)

{
  int iVar1;
  char *in_R9;
  size_t i;
  long lVar2;
  bool bVar3;
  vector<int,_std::allocator<int>_> multipliers;
  AssertionResult gtest_ar_;
  AssertHelper local_b0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  char *local_a0 [7];
  big_integer accumulator;
  
  for (iVar1 = 0; iVar1 != 10; iVar1 = iVar1 + 1) {
    multipliers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    multipliers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    multipliers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    lVar2 = 1000;
    while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
      accumulator._0_4_ = anon_unknown.dwarf_a16b::myrand();
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&multipliers,(int *)&accumulator);
    }
    big_integer::big_integer(&accumulator,1);
    for (lVar2 = 0; lVar2 != 1000; lVar2 = lVar2 + 1) {
      big_integer::big_integer
                ((big_integer *)local_a0,
                 multipliers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar2]);
      big_integer::operator*=(&accumulator,(big_integer *)local_a0);
      big_integer::~big_integer((big_integer *)local_a0);
    }
    std::random_shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               multipliers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               multipliers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish);
    for (lVar2 = 1; lVar2 != 1000; lVar2 = lVar2 + 1) {
      big_integer::big_integer
                ((big_integer *)local_a0,
                 multipliers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar2]);
      big_integer::operator/=(&accumulator,(big_integer *)local_a0);
      big_integer::~big_integer((big_integer *)local_a0);
    }
    big_integer::big_integer
              ((big_integer *)local_a0,
               *multipliers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start);
    gtest_ar_.success_ = operator==(&accumulator,(big_integer *)local_a0);
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    big_integer::~big_integer((big_integer *)local_a0);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&local_a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_a0,(internal *)&gtest_ar_,
                 (AssertionResult *)"accumulator == multipliers[0]","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/YaroslavZhurba[P]BigInt/big_integer_testing.cpp"
                 ,0x286,local_a0[0]);
      testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_a8);
      testing::internal::AssertHelper::~AssertHelper(&local_b0);
      std::__cxx11::string::~string((string *)local_a0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_a8);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    big_integer::~big_integer(&accumulator);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&multipliers.super__Vector_base<int,_std::allocator<int>_>);
  }
  return;
}

Assistant:

TEST(correctness, mul_div_randomized)
{
    for (unsigned itn = 0; itn != number_of_iterations; ++itn)
    {
        std::vector<int> multipliers;

        for (size_t i = 0; i != number_of_multipliers; ++i)
            multipliers.push_back(myrand());

        big_integer accumulator = 1;

        for (size_t i = 0; i != number_of_multipliers; ++i)
            accumulator *= multipliers[i];

        std::random_shuffle(multipliers.begin(), multipliers.end());

        for (size_t i = 1; i != number_of_multipliers; ++i) {
            accumulator /= multipliers[i];
        }

        EXPECT_TRUE(accumulator == multipliers[0]);
    }
}